

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O3

_Bool chck_pool(chck_pool *pool,size_t grow,size_t capacity,size_t member_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Bool _Var3;
  ulong uVar4;
  
  if ((pool != (chck_pool *)0x0) && (member_size != 0)) {
    _Var3 = false;
    memset(pool,0,0x90);
    uVar4 = 0x20;
    if (grow != 0) {
      uVar4 = grow;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = member_size;
    (pool->items).step = SUB168(auVar1 * auVar2,0);
    if (SUB168(auVar1 * auVar2,8) == 0) {
      (pool->items).member = member_size;
      if (capacity == 0) {
        (pool->map).step = uVar4;
        (pool->map).member = 1;
      }
      else {
        chck_pool_cold_1();
      }
      (pool->removed).step = uVar4 << 3;
      if (uVar4 >> 0x3d == 0) {
        (pool->removed).member = 8;
        _Var3 = true;
      }
      else {
        _Var3 = false;
      }
    }
    return _Var3;
  }
  __assert_fail("pool && member_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x11c,"_Bool chck_pool(struct chck_pool *, size_t, size_t, size_t)");
}

Assistant:

bool
chck_pool(struct chck_pool *pool, size_t grow, size_t capacity, size_t member_size)
{
   assert(pool && member_size > 0);

   if (unlikely(!member_size))
      return false;

   *pool = (struct chck_pool){0};
   return (pool_buffer(&pool->items, grow, capacity, member_size) &&
           pool_buffer(&pool->map, grow, capacity, sizeof(bool)) &&
           pool_buffer(&pool->removed, grow, 0, sizeof(size_t)));
}